

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86_fma::forward_inplace(UnaryOp_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  undefined1 auVar4 [32];
  long lVar5;
  ulong uVar6;
  Option *extraout_RDX;
  Option *extraout_RDX_00;
  Option *extraout_RDX_01;
  Option *extraout_RDX_02;
  Option *extraout_RDX_03;
  Option *extraout_RDX_04;
  ulong uVar7;
  Option *extraout_RDX_05;
  Option *extraout_RDX_06;
  Option *extraout_RDX_07;
  undefined1 (*pauVar8) [32];
  int iVar9;
  long lVar10;
  float *pfVar11;
  int iVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  __m256 afVar15;
  undefined1 auVar27 [56];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar41 [64];
  undefined1 in_XMM11 [16];
  __m128 afVar42;
  unary_op_tanh op;
  unary_op_tanh local_a9;
  ulong local_a8;
  size_t local_a0;
  size_t local_98;
  ulong local_90;
  Mat *local_88;
  __m256 local_80 [2];
  
  local_88 = bottom_top_blob;
  switch(*(undefined4 *)(&this->field_0xd0 + (long)this->_vptr_UnaryOp_x86_fma[-3])) {
  case 0:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    auVar28._8_4_ = 0x7fffffff;
    auVar28._0_8_ = 0x7fffffff7fffffff;
    auVar28._12_4_ = 0x7fffffff;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar16 = *pauVar8;
        auVar33._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        auVar33._8_4_ = auVar16._8_4_ ^ 0x80000000;
        auVar33._12_4_ = auVar16._12_4_ ^ 0x80000000;
        auVar33._16_4_ = auVar16._16_4_ ^ 0x80000000;
        auVar33._20_4_ = auVar16._20_4_ ^ 0x80000000;
        auVar33._24_4_ = auVar16._24_4_ ^ 0x80000000;
        auVar33._28_4_ = auVar16._28_4_ ^ 0x80000000;
        auVar16 = vmaxps_avx(auVar33,auVar16);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar29 = vandps_avx(auVar28,*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar29;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar29 = vandps_avx(ZEXT416(*(uint *)((long)pvVar1 + lVar10 * 4 + lVar5)),auVar28);
        *(int *)((long)pvVar1 + lVar10 * 4 + lVar5) = auVar29._0_4_;
      }
    }
    break;
  case 1:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar16 = *pauVar8;
        auVar31._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
        auVar31._8_4_ = auVar16._8_4_ ^ 0x80000000;
        auVar31._12_4_ = auVar16._12_4_ ^ 0x80000000;
        auVar31._16_4_ = auVar16._16_4_ ^ 0x80000000;
        auVar31._20_4_ = auVar16._20_4_ ^ 0x80000000;
        auVar31._24_4_ = auVar16._24_4_ ^ 0x80000000;
        auVar31._28_4_ = auVar16._28_4_ ^ 0x80000000;
        *pauVar8 = auVar31;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar29 = *(undefined1 (*) [16])*pauVar8;
        auVar30._0_8_ = auVar29._0_8_ ^ 0x8000000080000000;
        auVar30._8_4_ = auVar29._8_4_ ^ 0x80000000;
        auVar30._12_4_ = auVar29._12_4_ ^ 0x80000000;
        *(undefined1 (*) [16])*pauVar8 = auVar30;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        *(uint *)((long)pvVar1 + lVar10 * 4 + lVar5) =
             *(uint *)((long)pvVar1 + lVar10 * 4 + lVar5) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar16 = vroundps_avx(*pauVar8,1);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar29 = vroundps_avx(*(undefined1 (*) [16])*pauVar8,1);
        *(undefined1 (*) [16])*pauVar8 = auVar29;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar29 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar1 + lVar10 * 4 + lVar5)),
                               9);
        *(int *)((long)pvVar1 + lVar10 * 4 + lVar5) = auVar29._0_4_;
      }
    }
    break;
  case 3:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar16 = vroundps_avx(*pauVar8,2);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar29 = vroundps_avx(*(undefined1 (*) [16])*pauVar8,2);
        *(undefined1 (*) [16])*pauVar8 = auVar29;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar29 = vroundss_avx(in_ZMM1._0_16_,ZEXT416(*(uint *)((long)pvVar1 + lVar10 * 4 + lVar5)),
                               10);
        *(int *)((long)pvVar1 + lVar10 * 4 + lVar5) = auVar29._0_4_;
      }
    }
    break;
  case 4:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar4._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar8 + 4);
        auVar4._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar8;
        auVar4._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar8 + 8);
        auVar4._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar8 + 0xc);
        auVar4._16_4_ = *(float *)(*pauVar8 + 0x10) * *(float *)(*pauVar8 + 0x10);
        auVar4._20_4_ = *(float *)(*pauVar8 + 0x14) * *(float *)(*pauVar8 + 0x14);
        auVar4._24_4_ = *(float *)(*pauVar8 + 0x18) * *(float *)(*pauVar8 + 0x18);
        auVar4._28_4_ = *(undefined4 *)(*pauVar8 + 0x1c);
        *pauVar8 = auVar4;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar14._0_4_ = *(float *)*pauVar8 * *(float *)*pauVar8;
        auVar14._4_4_ = *(float *)(*pauVar8 + 4) * *(float *)(*pauVar8 + 4);
        auVar14._8_4_ = *(float *)(*pauVar8 + 8) * *(float *)(*pauVar8 + 8);
        auVar14._12_4_ = *(float *)(*pauVar8 + 0xc) * *(float *)(*pauVar8 + 0xc);
        *(undefined1 (*) [16])*pauVar8 = auVar14;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = *(float *)((long)pvVar1 + lVar10 * 4 + lVar5);
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13 * fVar13;
      }
    }
    break;
  case 5:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    auVar17._8_4_ = 0xc0400000;
    auVar17._0_8_ = 0xc0400000c0400000;
    auVar17._12_4_ = 0xc0400000;
    auVar17._16_4_ = 0xc0400000;
    auVar17._20_4_ = 0xc0400000;
    auVar17._24_4_ = 0xc0400000;
    auVar17._28_4_ = 0xc0400000;
    auVar32._8_4_ = 0x7fffffff;
    auVar32._0_8_ = 0x7fffffff7fffffff;
    auVar32._12_4_ = 0x7fffffff;
    auVar32._16_4_ = 0x7fffffff;
    auVar32._20_4_ = 0x7fffffff;
    auVar32._24_4_ = 0x7fffffff;
    auVar32._28_4_ = 0x7fffffff;
    auVar34._8_4_ = 0x800000;
    auVar34._0_8_ = 0x80000000800000;
    auVar34._12_4_ = 0x800000;
    auVar34._16_4_ = 0x800000;
    auVar34._20_4_ = 0x800000;
    auVar34._24_4_ = 0x800000;
    auVar34._28_4_ = 0x800000;
    auVar35._8_4_ = 0xc0400000;
    auVar35._0_8_ = 0xc0400000c0400000;
    auVar35._12_4_ = 0xc0400000;
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar37._8_4_ = 0x800000;
    auVar37._0_8_ = 0x80000000800000;
    auVar37._12_4_ = 0x800000;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar16 = *pauVar8;
        auVar39 = vrsqrtps_avx(auVar16);
        auVar41._0_4_ = auVar16._0_4_ * auVar39._0_4_;
        auVar41._4_4_ = auVar16._4_4_ * auVar39._4_4_;
        auVar41._8_4_ = auVar16._8_4_ * auVar39._8_4_;
        auVar41._12_4_ = auVar16._12_4_ * auVar39._12_4_;
        auVar41._16_4_ = auVar16._16_4_ * auVar39._16_4_;
        auVar41._20_4_ = auVar16._20_4_ * auVar39._20_4_;
        auVar41._28_36_ = in_ZMM10._28_36_;
        auVar41._24_4_ = auVar16._24_4_ * auVar39._24_4_;
        auVar29 = vfmadd213ps_fma(auVar39,auVar41._0_32_,auVar17);
        in_ZMM10 = ZEXT3264(CONCAT428(in_ZMM10._28_4_,
                                      CONCAT424(auVar41._24_4_ * -0.5,
                                                CONCAT420(auVar41._20_4_ * -0.5,
                                                          CONCAT416(auVar41._16_4_ * -0.5,
                                                                    CONCAT412(auVar41._12_4_ * -0.5,
                                                                              CONCAT48(auVar41._8_4_
                                                                                       * -0.5,
                                                  CONCAT44(auVar41._4_4_ * -0.5,auVar41._0_4_ * -0.5
                                                          ))))))));
        auVar39._0_4_ = auVar41._0_4_ * -0.5 * auVar29._0_4_;
        auVar39._4_4_ = auVar41._4_4_ * -0.5 * auVar29._4_4_;
        auVar39._8_4_ = auVar41._8_4_ * -0.5 * auVar29._8_4_;
        auVar39._12_4_ = auVar41._12_4_ * -0.5 * auVar29._12_4_;
        auVar39._16_4_ = auVar41._16_4_ * -0.5 * 0.0;
        auVar39._20_4_ = auVar41._20_4_ * -0.5 * 0.0;
        auVar39._24_4_ = auVar41._24_4_ * -0.5 * 0.0;
        auVar39._28_4_ = 0;
        auVar16 = vandps_avx(auVar16,auVar32);
        auVar16 = vcmpps_avx(auVar34,auVar16,2);
        auVar16 = vandps_avx(auVar16,auVar39);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar29 = *(undefined1 (*) [16])*pauVar8;
        auVar14 = vrsqrtps_avx(auVar29);
        auVar40._0_4_ = auVar29._0_4_ * auVar14._0_4_;
        auVar40._4_4_ = auVar29._4_4_ * auVar14._4_4_;
        auVar40._8_4_ = auVar29._8_4_ * auVar14._8_4_;
        auVar40._12_4_ = auVar29._12_4_ * auVar14._12_4_;
        auVar14 = vfmadd213ps_fma(auVar14,auVar40,auVar35);
        in_ZMM10 = ZEXT1664(CONCAT412(auVar40._12_4_ * -0.5,
                                      CONCAT48(auVar40._8_4_ * -0.5,
                                               CONCAT44(auVar40._4_4_ * -0.5,auVar40._0_4_ * -0.5)))
                           );
        auVar38._0_4_ = auVar40._0_4_ * -0.5 * auVar14._0_4_;
        auVar38._4_4_ = auVar40._4_4_ * -0.5 * auVar14._4_4_;
        auVar38._8_4_ = auVar40._8_4_ * -0.5 * auVar14._8_4_;
        auVar38._12_4_ = auVar40._12_4_ * -0.5 * auVar14._12_4_;
        auVar29 = vandps_avx(auVar29,auVar36);
        auVar29 = vcmpps_avx(auVar37,auVar29,2);
        auVar29 = vandps_avx(auVar29,auVar38);
        *(undefined1 (*) [16])*pauVar8 = auVar29;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        auVar29 = vsqrtss_avx(in_XMM11,ZEXT416(*(uint *)((long)pvVar1 + lVar10 * 4 + lVar5)));
        *(int *)((long)pvVar1 + lVar10 * 4 + lVar5) = auVar29._0_4_;
      }
    }
    break;
  case 6:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar16 = vrsqrtps_avx(*pauVar8);
        *pauVar8 = auVar16;
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar29 = vrsqrtps_avx(*(undefined1 (*) [16])*pauVar8);
        *(undefined1 (*) [16])*pauVar8 = auVar29;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = *(float *)((long)pvVar1 + lVar10 * 4 + lVar5);
        auVar29 = vrsqrtss_avx(ZEXT416((uint)fVar13),ZEXT416((uint)fVar13));
        auVar35 = vfmadd213ss_fma(ZEXT416((uint)(fVar13 * auVar29._0_4_)),auVar29,
                                  SUB6416(ZEXT464(0xc0400000),0));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = auVar29._0_4_ * -0.5 * auVar35._0_4_;
      }
    }
    break;
  case 7:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_exp::func_pack8((unary_op_exp *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_exp::func_pack4
                            ((unary_op_exp *)&local_a9,(__m128 *)local_80);
        auVar23._0_8_ = afVar42._0_8_;
        auVar23._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar23._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = expf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 8:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_log::func_pack8((unary_op_log *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_log::func_pack4
                            ((unary_op_log *)&local_a9,(__m128 *)local_80);
        auVar26._0_8_ = afVar42._0_8_;
        auVar26._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar26._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = logf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 9:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_sin::func_pack8((unary_op_sin *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_sin::func_pack4
                            ((unary_op_sin *)&local_a9,(__m128 *)local_80);
        auVar22._0_8_ = afVar42._0_8_;
        auVar22._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar22._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = sinf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 10:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_cos::func_pack8((unary_op_cos *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_cos::func_pack4
                            ((unary_op_cos *)&local_a9,(__m128 *)local_80);
        auVar25._0_8_ = afVar42._0_8_;
        auVar25._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar25._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = cosf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 0xb:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_tan::func_pack8((unary_op_tan *)&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_tan::func_pack4
                            ((unary_op_tan *)&local_a9,(__m128 *)local_80);
        auVar20._0_8_ = afVar42._0_8_;
        auVar20._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar20._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = tanf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 0xc:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_asin::func_pack8
                  ((__m256 *)&local_a9,(unary_op_asin *)local_80,(__m256 *)opt);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
        opt = extraout_RDX_02;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_asin::func_pack4
                            ((unary_op_asin *)&local_a9,(__m128 *)local_80);
        auVar21._0_8_ = afVar42._0_8_;
        auVar21._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar21._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
        opt = extraout_RDX_03;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = asinf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
        opt = extraout_RDX_04;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 0xd:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_acos::func_pack8
                  ((__m256 *)&local_a9,(unary_op_acos *)local_80,(__m256 *)opt);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
        opt = extraout_RDX_05;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_acos::func_pack4
                            ((unary_op_acos *)&local_a9,(__m128 *)local_80);
        auVar24._0_8_ = afVar42._0_8_;
        auVar24._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar24._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
        opt = extraout_RDX_06;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = acosf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
        opt = extraout_RDX_07;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 0xe:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_atan::func_pack8
                  ((__m256 *)&local_a9,(unary_op_atan *)local_80,(__m256 *)opt);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
        opt = extraout_RDX;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_atan::func_pack4
                            ((unary_op_atan *)&local_a9,(__m128 *)local_80);
        auVar19._0_8_ = afVar42._0_8_;
        auVar19._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar19._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
        opt = extraout_RDX_00;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = atanf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
        opt = extraout_RDX_01;
      }
      local_90 = uVar6 + 1;
    }
    break;
  case 0xf:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar7 = 0;
    uVar6 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar6 = uVar7;
    }
    auVar16._8_4_ = 0x3f800000;
    auVar16._0_8_ = 0x3f8000003f800000;
    auVar16._12_4_ = 0x3f800000;
    auVar16._16_4_ = 0x3f800000;
    auVar16._20_4_ = 0x3f800000;
    auVar16._24_4_ = 0x3f800000;
    auVar16._28_4_ = 0x3f800000;
    auVar29._8_4_ = 0x3f800000;
    auVar29._0_8_ = 0x3f8000003f800000;
    auVar29._12_4_ = 0x3f800000;
    for (; uVar7 != uVar6; uVar7 = uVar7 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar8 = (undefined1 (*) [32])(sVar3 * uVar7 * sVar2 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        auVar17 = vrcpps_avx(*pauVar8);
        auVar35 = vfmsub213ps_fma(*pauVar8,auVar17,auVar16);
        auVar35 = vfnmadd132ps_fma(ZEXT1632(auVar35),auVar17,auVar17);
        *pauVar8 = ZEXT1632(auVar35);
        pauVar8 = pauVar8 + 1;
        lVar10 = lVar10 + 8;
      }
      for (; iVar12 + 3 < iVar9; iVar12 = iVar12 + 4) {
        auVar35 = vrcpps_avx(*(undefined1 (*) [16])*pauVar8);
        auVar36 = vfmsub213ps_fma(*(undefined1 (*) [16])*pauVar8,auVar35,auVar29);
        auVar35 = vfnmadd132ps_fma(auVar36,auVar35,auVar35);
        *(undefined1 (*) [16])*pauVar8 = auVar35;
        pauVar8 = (undefined1 (*) [32])(*pauVar8 + 0x10);
        lVar10 = lVar10 + 4;
      }
      lVar5 = sVar3 * sVar2 * uVar7;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) =
             1.0 / *(float *)((long)pvVar1 + lVar10 * 4 + lVar5);
      }
    }
    break;
  case 0x10:
    iVar9 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    local_90 = 0;
    local_a8 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      local_a8 = local_90;
    }
    while (local_90 != local_a8) {
      pvVar1 = bottom_top_blob->data;
      local_a0 = bottom_top_blob->elemsize;
      local_98 = bottom_top_blob->cstep;
      pfVar11 = (float *)(local_98 * local_90 * local_a0 + (long)pvVar1);
      lVar10 = 0;
      for (iVar12 = 0; iVar12 + 7 < iVar9; iVar12 = iVar12 + 8) {
        local_80[0] = *(__m256 *)pfVar11;
        afVar15 = local_80[0];
        UnaryOp_x86_fma_functor::unary_op_tanh::func_pack8(&local_a9,local_80);
        *(__m256 *)pfVar11 = afVar15;
        pfVar11 = pfVar11 + 8;
        lVar10 = lVar10 + 8;
      }
      for (; bottom_top_blob = local_88, uVar6 = local_90, iVar12 + 3 < iVar9; iVar12 = iVar12 + 4)
      {
        local_80[0]._0_16_ = *(undefined1 (*) [16])pfVar11;
        auVar27 = ZEXT856(*(ulong *)(pfVar11 + 2));
        afVar42 = UnaryOp_x86_fma_functor::unary_op_tanh::func_pack4(&local_a9,(__m128 *)local_80);
        auVar18._0_8_ = afVar42._0_8_;
        auVar18._8_56_ = auVar27;
        *(undefined1 (*) [16])pfVar11 = auVar18._0_16_;
        pfVar11 = pfVar11 + 4;
        lVar10 = lVar10 + 4;
      }
      lVar5 = local_98 * local_a0 * local_90;
      for (; (int)lVar10 < iVar9; lVar10 = lVar10 + 1) {
        fVar13 = tanhf(*(float *)((long)pvVar1 + lVar10 * 4 + lVar5));
        *(float *)((long)pvVar1 + lVar10 * 4 + lVar5) = fVar13;
      }
      local_90 = uVar6 + 1;
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_fma_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    return 0;
}